

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamfilters.h
# Opt level: O3

void __thiscall
embree::LineCommentFilter::LineCommentFilter
          (LineCommentFilter *this,FileName *fileName,string *lineComment)

{
  pointer pcVar1;
  FileStream *this_00;
  allocator_type local_31;
  
  (this->super_Stream<int>).super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (this->super_Stream<int>).super_RefCount._vptr_RefCount = (_func_int **)&PTR__Stream_002c0eb8;
  (this->super_Stream<int>).start = 0;
  (this->super_Stream<int>).past = 0;
  (this->super_Stream<int>).future = 0;
  std::
  vector<std::pair<int,_embree::ParseLocation>,_std::allocator<std::pair<int,_embree::ParseLocation>_>_>
  ::vector(&(this->super_Stream<int>).buffer,0x400,&local_31);
  (this->super_Stream<int>).super_RefCount._vptr_RefCount =
       (_func_int **)&PTR__LineCommentFilter_002c0e48;
  this_00 = (FileStream *)operator_new(0x270);
  FileStream::FileStream(this_00,fileName);
  (this->cin).ptr = (Stream<int> *)this_00;
  (*(this_00->super_Stream<int>).super_RefCount._vptr_RefCount[2])(this_00);
  (this->lineComment)._M_dataplus._M_p = (pointer)&(this->lineComment).field_2;
  pcVar1 = (lineComment->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->lineComment,pcVar1,pcVar1 + lineComment->_M_string_length);
  return;
}

Assistant:

LineCommentFilter (const FileName& fileName, const std::string& lineComment)
      : cin(new FileStream(fileName)), lineComment(lineComment) {}